

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O0

void __thiscall
SparseArray_IteratorInitialization_Test<pstore::uint128>::TestBody
          (SparseArray_IteratorInitialization_Test<pstore::uint128> *this)

{
  bool bVar1;
  iterator first_index;
  iterator last_index;
  iterator first_value;
  iterator last_value;
  reference pvVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_160;
  Message local_158;
  int local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_118;
  Message local_110;
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__1;
  Message local_e8;
  int local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_a8;
  Message local_a0;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  Message local_78 [3];
  int local_5c;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  sparse_array<int,_pstore::uint128> *arr;
  unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
  arrp;
  array<int,_3UL> v1;
  array<unsigned_long,_3UL> i1;
  SparseArray_IteratorInitialization_Test<pstore::uint128> *this_local;
  
  stack0xffffffffffffffd8 = 0;
  arrp._M_t.
  super___uniq_ptr_impl<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::sparse_array<int,_pstore::uint128>_*,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
  .super__Head_base<0UL,_pstore::sparse_array<int,_pstore::uint128>_*,_false>._M_head_impl =
       (__uniq_ptr_data<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>,_true,_true>
        )(__uniq_ptr_impl<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
          )0x200000001;
  v1._M_elems[0] = 3;
  first_index = std::begin<std::array<unsigned_long,3ul>>
                          ((array<unsigned_long,_3UL> *)(v1._M_elems + 2));
  last_index = std::end<std::array<unsigned_long,3ul>>
                         ((array<unsigned_long,_3UL> *)(v1._M_elems + 2));
  first_value = std::begin<std::array<int,3ul>>((array<int,_3UL> *)&arrp);
  last_value = std::end<std::array<int,3ul>>((array<int,_3UL> *)&arrp);
  pstore::sparse_array<int,pstore::uint128>::make_unique<unsigned_long*,int*>
            ((sparse_array<int,pstore::uint128> *)&arr,first_index,last_index,first_value,last_value
            );
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::
         unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
         ::operator*((unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
                      *)&arr);
  pvVar2 = pstore::sparse_array<int,_pstore::uint128>::operator[]
                     ((sparse_array<int,_pstore::uint128> *)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0);
  local_5c = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_58,"arr[0]","1",pvVar2,&local_5c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x9f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_91 = pstore::sparse_array<int,_pstore::uint128>::has_index
                       ((sparse_array<int,_pstore::uint128> *)
                        gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl,1);
  local_91 = !local_91;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_90,
               (AssertionResult *)"arr.has_index (1)","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0xa0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  pvVar2 = pstore::sparse_array<int,_pstore::uint128>::operator[]
                     ((sparse_array<int,_pstore::uint128> *)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,2);
  local_dc = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_d8,"arr[2]","2",pvVar2,&local_dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0xa1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_101 = pstore::sparse_array<int,_pstore::uint128>::has_index
                        ((sparse_array<int,_pstore::uint128> *)
                         gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,3);
  local_101 = !local_101;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_100,&local_101,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_100,
               (AssertionResult *)"arr.has_index (3)","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0xa2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  pvVar2 = pstore::sparse_array<int,_pstore::uint128>::operator[]
                     ((sparse_array<int,_pstore::uint128> *)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,4);
  local_14c = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_148,"arr[4]","3",pvVar2,&local_14c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0xa3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  std::
  unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
  ::~unique_ptr((unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
                 *)&arr);
  return;
}

Assistant:

TYPED_TEST (SparseArray, IteratorInitialization) {
    std::array<std::size_t, 3> i1{{0, 2, 4}};
    std::array<int, 3> v1{{1, 2, 3}};

    auto arrp = sparse_array<int, TypeParam>::make_unique (std::begin (i1), std::end (i1),
                                                           std::begin (v1), std::end (v1));
    auto & arr = *arrp;

    EXPECT_EQ (arr[0], 1);
    EXPECT_FALSE (arr.has_index (1));
    EXPECT_EQ (arr[2], 2);
    EXPECT_FALSE (arr.has_index (3));
    EXPECT_EQ (arr[4], 3);
}